

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O0

int uv_fs_poll_stop(uv_fs_poll_t *handle)

{
  uv_close_cb close_cb;
  uv_handle_t *in_RDI;
  poll_ctx *ctx;
  
  if ((in_RDI->flags & 0x4000U) != 0) {
    close_cb = in_RDI[1].close_cb;
    if (close_cb == (uv_close_cb)0x0) {
      __assert_fail("ctx != NULL","src/fs-poll.c",0x68,"int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    if (*(long *)close_cb == 0) {
      __assert_fail("ctx->parent_handle != NULL","src/fs-poll.c",0x69,
                    "int uv_fs_poll_stop(uv_fs_poll_t *)");
    }
    *(undefined8 *)close_cb = 0;
    in_RDI[1].close_cb = (uv_close_cb)0x0;
    if ((*(uint *)(close_cb + 0x58) & 0x4000) != 0) {
      uv_close(in_RDI,close_cb);
    }
    if (((in_RDI->flags & 0x4000U) != 0) &&
       (in_RDI->flags = in_RDI->flags & 0xffffbfff, (in_RDI->flags & 0x2000U) != 0)) {
      in_RDI->loop->active_handles = in_RDI->loop->active_handles - 1;
    }
  }
  return 0;
}

Assistant:

int uv_fs_poll_stop(uv_fs_poll_t* handle) {
  struct poll_ctx* ctx;

  if (!uv__is_active(handle))
    return 0;

  ctx = handle->poll_ctx;
  assert(ctx != NULL);
  assert(ctx->parent_handle != NULL);
  ctx->parent_handle = NULL;
  handle->poll_ctx = NULL;

  /* Close the timer if it's active. If it's inactive, there's a stat request
   * in progress and poll_cb will take care of the cleanup.
   */
  if (uv__is_active(&ctx->timer_handle))
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);

  uv__handle_stop(handle);

  return 0;
}